

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stop_bit.cpp
# Opt level: O1

ssize_t cornelich::util::stop_bit::write(int __fd,void *__buf,size_t __n)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  undefined4 in_register_0000003c;
  
  if (0x7f < __n) {
    if (0x3fff < __n) {
      uVar3 = (long)__n >> 0x3f ^ __n;
      uVar4 = uVar3;
      if (0x7f < uVar3) {
        do {
          uVar3 = uVar4 >> 7;
          iVar1 = *__buf;
          *(int *)__buf = iVar1 + 1;
          *(byte *)(CONCAT44(in_register_0000003c,__fd) + (long)iVar1) = (byte)uVar4 | 0x80;
          bVar2 = 0x3fff < uVar4;
          uVar4 = uVar3;
        } while (bVar2);
      }
      if ((long)__n < 0) {
        iVar1 = *__buf;
        *(int *)__buf = iVar1 + 1;
        *(byte *)(CONCAT44(in_register_0000003c,__fd) + (long)iVar1) = (byte)uVar3 | 0x80;
        uVar3 = 0;
      }
      goto LAB_00116fed;
    }
    iVar1 = *__buf;
    *(int *)__buf = iVar1 + 1;
    *(byte *)(CONCAT44(in_register_0000003c,__fd) + (long)iVar1) = (byte)__n | 0x80;
    __n = __n >> 7 & 0x1ffffff;
  }
  uVar3 = __n & 0xffffffff;
LAB_00116fed:
  iVar1 = *__buf;
  *(int *)__buf = iVar1 + 1;
  *(char *)(CONCAT44(in_register_0000003c,__fd) + (long)iVar1) = (char)uVar3;
  return uVar3;
}

Assistant:

void write(std::uint8_t * buffer, std::int32_t & offset, std::int64_t value)
{
    if((value & ~0x7F) == 0)
    {
        buffer[offset++] = value & 0x7f;
        return;
    }
    if((value & ~0x3FFF) == 0)
    {
        buffer[offset++] = static_cast<std::uint8_t>(value & 0x7f) | 0x80;
        buffer[offset++] = static_cast<std::uint8_t>(value >> 7);
        return;
    }
    auto neg = false;
    if(value < 0)
    {
        neg = true;
        value = ~value;
    }
    std::uint64_t n2;
    while ((n2 = static_cast<std::uint64_t>(value >> 7)) != 0)
    {
        buffer[offset++] = static_cast<std::uint8_t>(0x80L | value);
        value = static_cast<std::int64_t>(n2);
    }
    // final byte
    if (!neg)
        buffer[offset++] = static_cast<std::uint8_t>(value);
    else
    {
        buffer[offset++] = static_cast<std::uint8_t>(0x80 | value);
        buffer[offset++] = 0;
    }
}